

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

void bcm2835_gpio_set_pud(uint8_t pin,uint8_t pud)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  uint32_t *puVar4;
  uint32_t uVar5;
  
  if (pud_type_rpi4 != '\x01') {
    bcm2835_gpio_pud(pud);
    bcm2835_delayMicroseconds(10);
    bcm2835_gpio_pudclk(pin,'\x01');
    bcm2835_delayMicroseconds(10);
    bcm2835_gpio_pud('\0');
    bcm2835_gpio_pudclk(pin,'\0');
    return;
  }
  if (pud < 3) {
    bVar3 = pin * '\x02' & 0x1e;
    iVar1 = *(int *)(&DAT_00106160 + (ulong)pud * 4);
    puVar4 = bcm2835_gpio + (ulong)(pin >> 4) + 0x39;
    if (debug == '\0') {
      uVar5 = *puVar4;
    }
    else {
      uVar5 = 0;
      printf("bcm2835_peri_read_nb  paddr %p\n",puVar4);
    }
    uVar2 = iVar1 << bVar3 | ~(3 << bVar3) & uVar5;
    if (debug != '\0') {
      printf("bcm2835_peri_write_nb paddr %p, value %08X\n",puVar4,(ulong)uVar2);
      return;
    }
    *puVar4 = uVar2;
  }
  return;
}

Assistant:

void bcm2835_gpio_set_pud(uint8_t pin, uint8_t pud)
{
    if( pud_type_rpi4 )
    {
        int shiftbits = (pin & 0xf) << 1;
        uint32_t bits;
        uint32_t pull;
        
        switch (pud)
        {
           case BCM2835_GPIO_PUD_OFF:  pull = 0; break;
           case BCM2835_GPIO_PUD_UP:   pull = 1; break;
           case BCM2835_GPIO_PUD_DOWN: pull = 2; break;
           default: return;
        }
                
        volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPPUPPDN0/4 + (pin >> 4);
        
        bits = bcm2835_peri_read_nb( paddr );
        bits &= ~(3 << shiftbits);
        bits |= (pull << shiftbits);
        
        bcm2835_peri_write_nb( paddr, bits );
        
    } else
    {
    bcm2835_gpio_pud(pud);
    delayMicroseconds(10);
    bcm2835_gpio_pudclk(pin, 1);
    delayMicroseconds(10);
    bcm2835_gpio_pud(BCM2835_GPIO_PUD_OFF);
    bcm2835_gpio_pudclk(pin, 0);
}

}